

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetNavID(ImGuiID id,ImGuiNavLayer nav_layer,ImGuiID focus_scope_id,ImRect *rect_rel)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  
  pIVar3 = GImGui;
  GImGui->NavId = id;
  pIVar3->NavLayer = nav_layer;
  pIVar3->NavFocusScopeId = focus_scope_id;
  pIVar3->NavWindow->NavLastIds[nav_layer] = id;
  IVar2 = rect_rel->Max;
  pIVar1 = &pIVar3->NavWindow->NavRectRel[nav_layer].Min;
  *pIVar1 = rect_rel->Min;
  pIVar1[1] = IVar2;
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, ImGuiNavLayer nav_layer, ImGuiID focus_scope_id, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);
    IM_ASSERT(nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu);
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
}